

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.cpp
# Opt level: O0

void __thiscall Js::StreamWriter::Write(StreamWriter *this,void *pv,size_t cb)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  uint *puVar5;
  ThreadContext *pTVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  undefined1 local_80 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  ulong local_38;
  size_t newCapacity;
  ScriptContext *pSStack_28;
  uint32 newSize;
  ScriptContext *scriptContext;
  size_t cb_local;
  void *pv_local;
  StreamWriter *this_local;
  
  scriptContext = (ScriptContext *)cb;
  cb_local = (size_t)pv;
  pv_local = this;
  pSStack_28 = ScriptContextHolder::GetScriptContext(&this->super_ScriptContextHolder);
  newCapacity._4_4_ = UInt32Math::Add((uint32)this->m_current,(uint32)scriptContext);
  if (this->m_capacity <= (ulong)newCapacity._4_4_) {
    __frameAddr._4_4_ = UInt32Math::Mul((uint32)this->m_capacity,2);
    puVar5 = max<unsigned_int>((uint *)((long)&newCapacity + 4),(uint *)((long)&__frameAddr + 4));
    uVar3 = UInt32Math::Add(*puVar5,100);
    local_38 = (ulong)uVar3;
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled,pSStack_28,&this_local);
    pTVar6 = ScriptContext::GetThreadContext(pSStack_28);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_80,pTVar6);
    iVar4 = (**this->m_stream->_vptr_HostStream)
                      (this->m_stream,this->m_buffer,local_38,&this->m_capacity);
    this->m_buffer = (byte *)CONCAT44(extraout_var,iVar4);
    if (pSStack_28 != (ScriptContext *)0x0) {
      pTVar6 = ScriptContext::GetThreadContext(pSStack_28);
      ThreadContext::DisposeOnLeaveScript(pTVar6);
    }
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_80);
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)
               &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  }
  if (this->m_buffer == (byte *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/StreamWriter.cpp"
                                ,0x18,"(m_buffer != nullptr)","m_buffer != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  js_memcpy_s(this->m_buffer + this->m_current,(size_t)scriptContext,(void *)cb_local,
              (size_t)scriptContext);
  this->m_current =
       (long)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo + this->m_current;
  return;
}

Assistant:

void StreamWriter::Write(const void* pv, size_t cb)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 newSize = UInt32Math::Add((uint32)m_current, (uint32)cb);
        if (newSize >= m_capacity)
        {
            size_t newCapacity = UInt32Math::Add(max(newSize, UInt32Math::Mul((uint32)m_capacity, 2)), 100);
            BEGIN_LEAVE_SCRIPT(scriptContext)
            {
                m_buffer = m_stream->ExtendBuffer(m_buffer, newCapacity, &m_capacity);
            }
            END_LEAVE_SCRIPT(scriptContext);
        }

        Assert(m_buffer != nullptr);
        js_memcpy_s(m_buffer + m_current, cb, pv, cb);
        m_current += cb;
    }